

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxBitOp::Emit(FxBitOp *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint extraout_var;
  uint extraout_var_00;
  uint uVar6;
  ulong uVar7;
  ExpEmit EVar8;
  uint uVar9;
  ulong uVar5;
  
  pFVar1 = (this->super_FxBinary).left;
  if (pFVar1->ValueType->RegType != '\0') {
    __assert_fail("left->ValueType->GetRegType() == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xe5e,"virtual ExpEmit FxBitOp::Emit(VMFunctionBuilder *)");
  }
  if (((this->super_FxBinary).right)->ValueType->RegType != '\0') {
    __assert_fail("right->ValueType->GetRegType() == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xe5f,"virtual ExpEmit FxBitOp::Emit(VMFunctionBuilder *)");
  }
  iVar3 = (*pFVar1->_vptr_FxExpression[9])();
  uVar5 = CONCAT44(extraout_var,iVar3);
  uVar6 = extraout_var >> 8;
  pFVar1 = (this->super_FxBinary).right;
  iVar3 = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
  uVar7 = CONCAT44(extraout_var_00,iVar3);
  uVar4 = extraout_var;
  uVar2 = extraout_var_00;
  uVar9 = extraout_var_00 >> 8;
  if ((extraout_var & 1) != 0) {
    uVar7 = uVar5;
    uVar5 = CONCAT44(extraout_var_00,iVar3);
    uVar4 = extraout_var_00;
    uVar2 = extraout_var;
    uVar9 = uVar6;
    uVar6 = extraout_var_00 >> 8;
  }
  if ((uVar4 & 1) != 0) {
    __assert_fail("!op1.Konst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xe69,"virtual ExpEmit FxBitOp::Emit(VMFunctionBuilder *)");
  }
  if ((((uVar9 & 1) == 0) && ((uVar2 & 1) == 0)) && ((uVar7 & 0xfc0000) == 0)) {
    VMFunctionBuilder::RegAvailability::Return
              (build->Registers + ((uint)(uVar7 >> 0x10) & 3),(uint)uVar7 & 0xffff,
               (uint)(uVar7 >> 0x18) & 0xff);
  }
  if (((uVar6 & 1) == 0) && ((uVar5 & 0xfc0000) == 0)) {
    VMFunctionBuilder::RegAvailability::Return
              (build->Registers + ((uint)(uVar5 >> 0x10) & 3),(uint)uVar5 & 0xffff,
               (uint)(uVar5 >> 0x18) & 0xff);
  }
  iVar3 = (this->super_FxBinary).Operator;
  if (iVar3 == 0x26) {
    uVar6 = 0x77;
  }
  else if (iVar3 == 0x7c) {
    uVar6 = 0x79;
  }
  else {
    uVar6 = -(uint)(iVar3 != 0x5e) | 0x7b;
  }
  if ((int)uVar6 < 1) {
    __assert_fail("instr > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xe72,"virtual ExpEmit FxBitOp::Emit(VMFunctionBuilder *)");
  }
  uVar4 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
  VMFunctionBuilder::Emit
            (build,uVar6 + (uVar2 & 0xff),uVar4 & 0xffff,(uint)uVar5 & 0xffff,(uint)uVar7 & 0xffff);
  EVar8._0_4_ = uVar4 & 0xffff | 0x1000000;
  EVar8.Konst = false;
  EVar8.Fixed = false;
  EVar8.Final = false;
  EVar8.Target = false;
  return EVar8;
}

Assistant:

ExpEmit FxBitOp::Emit(VMFunctionBuilder *build)
{
	assert(left->ValueType->GetRegType() == REGT_INT);
	assert(right->ValueType->GetRegType() == REGT_INT);
	int instr, rop;
	ExpEmit op1, op2;

	op1 = left->Emit(build);
	op2 = right->Emit(build);
	if (op1.Konst)
	{
		swapvalues(op1, op2);
	}
	assert(!op1.Konst);
	rop = op2.RegNum;
	op2.Free(build);
	op1.Free(build);

	instr = Operator == '&' ? OP_AND_RR :
			Operator == '|' ? OP_OR_RR :
			Operator == '^' ? OP_XOR_RR : -1;

	assert(instr > 0);
	ExpEmit to(build, REGT_INT);
	build->Emit(instr + op2.Konst, to.RegNum, op1.RegNum, rop);
	return to;
}